

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CreateClassInstance(SQVM *this,SQClass *theclass,SQObjectPtr *inst,SQObjectPtr *constructor)

{
  bool bVar1;
  SQClass *in_RCX;
  SQClass *in_RDX;
  SQObjectPtr *in_RSI;
  
  SQClass::CreateInstance(in_RCX);
  ::SQObjectPtr::operator=(in_RSI,(SQInstance *)in_RDX);
  bVar1 = SQClass::GetConstructor(in_RDX,(SQObjectPtr *)in_RCX);
  if (!bVar1) {
    ::SQObjectPtr::Null((SQObjectPtr *)in_RCX);
  }
  return true;
}

Assistant:

bool SQVM::CreateClassInstance(SQClass *theclass, SQObjectPtr &inst, SQObjectPtr &constructor)
{
    inst = theclass->CreateInstance();
    if(!theclass->GetConstructor(constructor)) {
        constructor.Null();
    }
    return true;
}